

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

lzma_match *
bt_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  lzma_match *plVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  uint32_t local_58;
  uint local_54;
  lzma_match *local_50;
  lzma_match *local_38;
  
  local_58 = len_best;
  local_50 = matches;
  puVar4 = son + cyclic_pos * 2;
  puVar6 = son + (ulong)(cyclic_pos * 2) + 1;
  local_54 = 0;
  uVar9 = 0;
  do {
    bVar11 = depth == 0;
    depth = depth - 1;
    if ((bVar11) || (uVar2 = pos - cur_match, cyclic_size <= uVar2)) {
      bVar11 = false;
      *puVar6 = 0;
      *puVar4 = 0;
      local_38 = local_50;
    }
    else {
      uVar5 = 0;
      if (cyclic_pos < uVar2) {
        uVar5 = cyclic_size;
      }
      uVar7 = uVar9;
      if (local_54 < uVar9) {
        uVar7 = local_54;
      }
      uVar10 = (ulong)uVar7;
      puVar3 = son + (uVar5 + (cyclic_pos - uVar2)) * 2;
      if (cur[uVar10 - uVar2] == cur[uVar10]) {
        do {
          uVar7 = uVar7 + 1;
          if (len_limit == uVar7) {
            uVar10 = (ulong)len_limit;
            goto LAB_0045d74a;
          }
        } while (cur[(ulong)uVar7 - (ulong)uVar2] == cur[uVar7]);
        uVar10 = (ulong)uVar7;
LAB_0045d74a:
        uVar8 = (uint)uVar10;
        if (local_58 < uVar8) {
          plVar1 = local_50 + 1;
          local_50->len = uVar8;
          local_50->dist = uVar2 - 1;
          local_58 = uVar8;
          local_50 = plVar1;
          if (len_limit == uVar7) {
            *puVar4 = *puVar3;
            *puVar6 = puVar3[1];
            bVar11 = false;
            local_38 = plVar1;
            goto LAB_0045d7dc;
          }
        }
      }
      uVar7 = (uint)uVar10;
      if (cur[uVar10 - uVar2] < cur[uVar10]) {
        *puVar4 = cur_match;
        puVar3 = puVar3 + 1;
        puVar4 = puVar3;
      }
      else {
        *puVar6 = cur_match;
        uVar10 = (ulong)uVar9;
        puVar6 = puVar3;
        local_54 = uVar7;
      }
      cur_match = *puVar3;
      bVar11 = true;
      uVar9 = (uint)uVar10;
    }
LAB_0045d7dc:
    if (!bVar11) {
      return local_38;
    }
  } while( true );
}

Assistant:

static lzma_match *
bt_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		uint32_t *pair;
		const uint8_t *pb;
		uint32_t len;

		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return matches;
		}

		pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);

		pb = cur - delta;
		len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit) {
					*ptr1 = pair[0];
					*ptr0 = pair[1];
					return matches;
				}
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}